

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O3

REF_STATUS
ref_geom_pcrv_tec_zone(REF_GRID ref_grid,REF_INT edgeid,REF_INT faceid,REF_INT sense,FILE *file)

{
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_GEOM ref_geom;
  REF_DBL *pRVar1;
  uint id;
  FILE *__stream;
  REF_INT RVar2;
  uint uVar3;
  REF_STATUS RVar4;
  uint uVar5;
  int *piVar6;
  REF_INT *pRVar7;
  undefined8 uVar8;
  char *pcVar9;
  int iVar10;
  ulong uVar11;
  void *__ptr;
  int iVar12;
  int iVar13;
  long lVar14;
  ulong uVar15;
  REF_DBL RVar16;
  REF_INT local;
  uint local_168;
  REF_INT sens;
  REF_DICT ref_dict;
  REF_DBL *local_158;
  REF_DBL radius;
  REF_DBL local_148;
  void *local_140;
  ulong local_138;
  FILE *local_130;
  REF_DBL gap;
  REF_DBL tvalue;
  REF_DBL xyz [3];
  long local_100;
  long local_f8;
  REF_DBL *local_e8;
  long local_e0;
  long local_d8;
  REF_INT nodes [27];
  REF_DBL normal [3];
  
  ref_node = ref_grid->node;
  ref_cell = ref_grid->cell[0];
  ref_geom = ref_grid->geom;
  local_130 = (FILE *)file;
  uVar3 = ref_dict_create(&ref_dict);
  if (uVar3 != 0) {
    pcVar9 = "create dict";
    uVar8 = 0xc17;
    goto LAB_0019e04e;
  }
  local_148 = (REF_DBL)CONCAT44(local_148._4_4_,sense);
  local_168 = faceid;
  if (ref_geom->max < 1) {
    iVar13 = -1;
  }
  else {
    pRVar7 = ref_geom->descr;
    uVar15 = 0xffffffff;
    lVar14 = 0;
    uVar11 = 0;
    do {
      if ((*(int *)((long)pRVar7 + lVar14) == 1) && (*(int *)((long)pRVar7 + lVar14 + 4) == edgeid))
      {
        uVar3 = ref_dict_store(ref_dict,*(REF_INT *)((long)pRVar7 + lVar14 + 0x14),(REF_INT)uVar11);
        if (uVar3 != 0) {
          pcVar9 = "mark nodes";
          uVar8 = 0xc1c;
          goto LAB_0019e04e;
        }
        pRVar7 = ref_geom->descr;
        if (*(int *)((long)pRVar7 + lVar14 + 0xc) != 0) {
          if ((int)uVar15 != -1) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0xc1e,"ref_geom_pcrv_tec_zone","should be only one jump per edge",
                   0xffffffffffffffff,(long)(int)uVar15);
            return 1;
          }
          uVar15 = uVar11 & 0xffffffff;
        }
      }
      iVar13 = (int)uVar15;
      uVar11 = uVar11 + 1;
      lVar14 = lVar14 + 0x18;
    } while ((long)uVar11 < (long)ref_geom->max);
  }
  if (0 < ref_cell->max) {
    uVar5 = ref_dict->n;
    local_138 = (ulong)((iVar13 != -1) + uVar5);
    iVar10 = 0;
    uVar3 = 0;
    do {
      RVar4 = ref_cell_nodes(ref_cell,iVar10,nodes);
      uVar11 = local_138;
      uVar3 = uVar3 + (nodes[2] == edgeid && RVar4 == 0);
      iVar10 = iVar10 + 1;
    } while (iVar10 < ref_cell->max);
    iVar10 = (int)local_138;
    if ((iVar10 != 0) && (uVar3 != 0)) {
      fprintf(local_130,"zone t=\"pcrv%df%d\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n"
              ,(ulong)(uint)edgeid,(ulong)local_168,local_138 & 0xffffffff,(ulong)uVar3,"point",
              "felineseg");
      if (iVar10 < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0xc38,"ref_geom_pcrv_tec_zone","malloc t of REF_DBL negative");
        return 1;
      }
      local_140 = malloc((uVar11 & 0xffffffff) << 3);
      if (local_140 == (void *)0x0) {
        pcVar9 = "malloc t of REF_DBL NULL";
        uVar8 = 0xc38;
LAB_0019e6b2:
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               uVar8,"ref_geom_pcrv_tec_zone",pcVar9);
        return 2;
      }
      local_158 = (REF_DBL *)malloc((ulong)(uint)(iVar10 * 2) << 3);
      if (local_158 == (REF_DBL *)0x0) {
        pcVar9 = "malloc uv of REF_DBL NULL";
        uVar8 = 0xc39;
        goto LAB_0019e6b2;
      }
      if (0 < ref_cell->max) {
        iVar12 = (int)local_138 + -1;
        iVar10 = 0;
        do {
          RVar4 = ref_cell_nodes(ref_cell,iVar10,nodes);
          if ((RVar4 == 0) && (nodes[2] == edgeid)) {
            uVar3 = ref_dict_location(ref_dict,nodes[0],&local);
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                     ,0xc40,"ref_geom_pcrv_tec_zone",(ulong)uVar3,"localize");
              printf("edg %d %d id %d no edge geom\n",(ulong)(uint)nodes[0],(ulong)(uint)nodes[1],
                     (ulong)(uint)nodes[2]);
              uVar5 = ref_node_location(ref_node,nodes[0]);
              if (uVar5 == 0) {
                ref_geom_tattle(ref_geom,nodes[0]);
                return uVar3;
              }
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                     ,0xc3e,"ref_geom_pcrv_tec_zone",(ulong)uVar5,"loc");
              return uVar5;
            }
            uVar3 = ref_geom_cell_tuv(ref_geom,nodes[0],nodes,1,&tvalue,&sens);
            if (uVar3 != 0) {
              pcVar9 = "from";
              uVar8 = 0xc43;
              goto LAB_0019e04e;
            }
            RVar2 = iVar12;
            if (sens != -1) {
              RVar2 = local;
            }
            local = RVar2;
            *(REF_DBL *)((long)local_140 + (long)local * 8) = tvalue;
            uVar3 = ref_egads_edge_face_uv
                              (ref_geom,edgeid,local_168,local_148._0_4_,tvalue,
                               local_158 + local * 2);
            if (uVar3 != 0) {
              pcVar9 = "p-curve uv";
              uVar8 = 0xc48;
              goto LAB_0019e04e;
            }
            uVar3 = ref_dict_location(ref_dict,nodes[1],&local);
            if (uVar3 != 0) {
              pcVar9 = "localize";
              uVar8 = 0xc49;
              goto LAB_0019e04e;
            }
            uVar3 = ref_geom_cell_tuv(ref_geom,nodes[1],nodes,1,&tvalue,&sens);
            if (uVar3 != 0) {
              pcVar9 = "from";
              uVar8 = 0xc4c;
              goto LAB_0019e04e;
            }
            RVar2 = iVar12;
            if (sens != -1) {
              RVar2 = local;
            }
            local = RVar2;
            *(REF_DBL *)((long)local_140 + (long)local * 8) = tvalue;
            uVar3 = ref_egads_edge_face_uv
                              (ref_geom,edgeid,local_168,local_148._0_4_,tvalue,
                               local_158 + local * 2);
            if (uVar3 != 0) {
              pcVar9 = "p-curve uv";
              uVar8 = 0xc51;
              goto LAB_0019e04e;
            }
          }
          iVar10 = iVar10 + 1;
        } while (iVar10 < ref_cell->max);
      }
      __ptr = local_140;
      if (0 < ref_dict->n) {
        piVar6 = ref_dict->key;
        pRVar7 = ref_dict->value;
        local_e0 = 4;
        local_d8 = 1;
        local_e8 = local_158;
        local_f8 = 0;
        local_100 = 0;
        while( true ) {
          iVar10 = *piVar6;
          lVar14 = (long)iVar10;
          radius = 0.0;
          gap = 0.0;
          pRVar1 = ref_node->real;
          xyz[0] = pRVar1[lVar14 * 0xf];
          xyz[1] = pRVar1[lVar14 * 0xf + 1];
          xyz[2] = pRVar1[lVar14 * 0xf + 2];
          if (ref_geom->model == (void *)0x0) {
            RVar16 = *(REF_DBL *)((long)__ptr + local_f8 * 4);
            lVar14 = local_f8;
          }
          else {
            uVar3 = ref_egads_edge_curvature(ref_geom,*pRVar7,&radius,normal);
            id = local_168;
            if (uVar3 != 0) {
              pcVar9 = "curve";
              uVar8 = 0xc5c;
              goto LAB_0019e04e;
            }
            if (radius <= -radius) {
              radius = -radius;
            }
            RVar16 = *(REF_DBL *)((long)__ptr + local_f8 * 4);
            uVar3 = ref_egads_edge_face_uv
                              (ref_geom,edgeid,local_168,local_148._0_4_,RVar16,local_e8);
            if (uVar3 != 0) {
              pcVar9 = "p-curve uv";
              uVar8 = 0xc60;
              goto LAB_0019e04e;
            }
            uVar3 = ref_egads_eval_at(ref_geom,2,id,local_e8,xyz,(REF_DBL *)0x0);
            if (uVar3 != 0) {
              pcVar9 = "eval at";
              uVar8 = 0xc63;
              goto LAB_0019e04e;
            }
            uVar3 = ref_egads_gap(ref_geom,iVar10,&gap);
            if (uVar3 != 0) {
              pcVar9 = "gap";
              uVar8 = 0xc64;
              goto LAB_0019e04e;
            }
            lVar14 = local_100 * 2;
            __ptr = local_140;
          }
          fprintf(local_130," %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e\n",xyz[0],xyz[1],
                  xyz[2],gap,local_158[lVar14],local_158[lVar14 + 1],radius,RVar16);
          if (ref_dict->n <= local_d8) break;
          piVar6 = (int *)((long)ref_dict->key + local_e0);
          local_f8 = local_f8 + 2;
          local_e8 = local_e8 + 2;
          pRVar7 = (REF_INT *)(local_e0 + (long)ref_dict->value);
          local_e0 = local_e0 + 4;
          local_d8 = local_d8 + 1;
          local_100 = local_100 + 1;
        }
      }
      if (iVar13 != -1) {
        iVar10 = ref_geom->descr[(long)(iVar13 * 6) + 5];
        lVar14 = (long)iVar10;
        radius = 0.0;
        gap = 0.0;
        pRVar1 = ref_node->real;
        xyz[0] = pRVar1[lVar14 * 0xf];
        xyz[1] = pRVar1[lVar14 * 0xf + 1];
        xyz[2] = pRVar1[lVar14 * 0xf + 2];
        if (ref_geom->model == (void *)0x0) {
          uVar11 = (ulong)(uVar5 * 2);
          RVar16 = *(REF_DBL *)((long)local_140 + (ulong)uVar5 * 8);
        }
        else {
          uVar3 = ref_egads_edge_curvature(ref_geom,iVar13,&radius,normal);
          if (uVar3 != 0) {
            pcVar9 = "curve";
            uVar8 = 0xc73;
            goto LAB_0019e04e;
          }
          if (radius <= -radius) {
            radius = -radius;
          }
          RVar16 = *(REF_DBL *)((long)local_140 + (ulong)uVar5 * 8);
          uVar11 = (ulong)(uVar5 * 2);
          pRVar1 = local_158 + uVar11;
          RVar2 = local_148._0_4_;
          local_148 = RVar16;
          uVar3 = ref_egads_edge_face_uv(ref_geom,edgeid,local_168,RVar2,RVar16,pRVar1);
          if (uVar3 != 0) {
            pcVar9 = "p-curve uv";
            uVar8 = 0xc77;
            goto LAB_0019e04e;
          }
          uVar3 = ref_egads_eval_at(ref_geom,2,local_168,pRVar1,xyz,(REF_DBL *)0x0);
          if (uVar3 != 0) {
            pcVar9 = "eval at";
            uVar8 = 0xc7a;
            goto LAB_0019e04e;
          }
          uVar3 = ref_egads_gap(ref_geom,iVar10,&gap);
          RVar16 = local_148;
          if (uVar3 != 0) {
            pcVar9 = "gap";
            uVar8 = 0xc7b;
            goto LAB_0019e04e;
          }
        }
        __ptr = local_140;
        fprintf(local_130," %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e\n",xyz[0],xyz[1],xyz[2],
                gap,local_158[uVar11],local_158[uVar11 + 1],radius,RVar16);
      }
      free(local_158);
      free(__ptr);
      if (0 < ref_cell->max) {
        local_168 = (int)local_138 - 1;
        iVar13 = 0;
        do {
          RVar4 = ref_cell_nodes(ref_cell,iVar13,nodes);
          if ((RVar4 == 0) && (nodes[2] == edgeid)) {
            uVar3 = ref_dict_location(ref_dict,nodes[0],&local);
            if (uVar3 != 0) {
              pcVar9 = "localize";
              uVar8 = 0xc87;
              goto LAB_0019e04e;
            }
            uVar3 = ref_geom_cell_tuv(ref_geom,nodes[0],nodes,1,&tvalue,&sens);
            if (uVar3 != 0) {
              pcVar9 = "from";
              uVar8 = 0xc8a;
              goto LAB_0019e04e;
            }
            if (sens == -1) {
              local = local_168;
              uVar11 = local_138 & 0xffffffff;
            }
            else {
              uVar11 = (ulong)(local + 1);
            }
            fprintf(local_130," %d",uVar11);
            uVar3 = ref_dict_location(ref_dict,nodes[1],&local);
            if (uVar3 != 0) {
              pcVar9 = "localize";
              uVar8 = 0xc8d;
              goto LAB_0019e04e;
            }
            uVar3 = ref_geom_cell_tuv(ref_geom,nodes[1],nodes,1,&tvalue,&sens);
            __stream = local_130;
            if (uVar3 != 0) {
              pcVar9 = "from";
              uVar8 = 0xc90;
              goto LAB_0019e04e;
            }
            if (sens == -1) {
              local = local_168;
              uVar11 = local_138 & 0xffffffff;
            }
            else {
              uVar11 = (ulong)(local + 1);
            }
            fprintf(local_130," %d",uVar11);
            fputc(10,__stream);
          }
          iVar13 = iVar13 + 1;
        } while (iVar13 < ref_cell->max);
      }
      uVar3 = ref_dict_free(ref_dict);
      if (uVar3 == 0) {
        return 0;
      }
      pcVar9 = "free dict";
      uVar8 = 0xc97;
      goto LAB_0019e04e;
    }
  }
  uVar3 = ref_dict_free(ref_dict);
  if (uVar3 == 0) {
    return 0;
  }
  pcVar9 = "free dict";
  uVar8 = 0xc2f;
LAB_0019e04e:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",uVar8,
         "ref_geom_pcrv_tec_zone",(ulong)uVar3,pcVar9);
  return uVar3;
}

Assistant:

REF_FCN REF_STATUS ref_geom_pcrv_tec_zone(REF_GRID ref_grid, REF_INT edgeid,
                                          REF_INT faceid, REF_INT sense,
                                          FILE *file) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_edg(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_DICT ref_dict;
  REF_INT geom, cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT item, local, node;
  REF_INT nnode, nedg, sens;
  REF_INT jump_geom = REF_EMPTY;
  REF_DBL *t, *uv, tvalue;
  REF_DBL radius, normal[3], xyz[3], gap;

  RSS(ref_dict_create(&ref_dict), "create dict");

  each_ref_geom_edge(ref_geom, geom) {
    if (edgeid == ref_geom_id(ref_geom, geom)) {
      RSS(ref_dict_store(ref_dict, ref_geom_node(ref_geom, geom), geom),
          "mark nodes");
      if (0 != ref_geom_jump(ref_geom, geom)) {
        REIS(REF_EMPTY, jump_geom, "should be only one jump per edge");
        jump_geom = geom;
      }
    }
  }
  nnode = ref_dict_n(ref_dict);
  if (REF_EMPTY != jump_geom) nnode++;

  nedg = 0;
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    if (edgeid == nodes[2]) {
      nedg++;
    }
  }

  /* skip degenerate */
  if (0 == nnode || 0 == nedg) {
    RSS(ref_dict_free(ref_dict), "free dict");
    return REF_SUCCESS;
  }

  fprintf(file,
          "zone t=\"pcrv%df%d\", nodes=%d, elements=%d, datapacking=%s, "
          "zonetype=%s\n",
          edgeid, faceid, nnode, nedg, "point", "felineseg");

  ref_malloc(t, nnode, REF_DBL);
  ref_malloc(uv, 2 * nnode, REF_DBL);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    if (edgeid == nodes[2]) {
      RSB(ref_dict_location(ref_dict, nodes[0], &local), "localize", {
        printf("edg %d %d id %d no edge geom\n", nodes[0], nodes[1], nodes[2]);
        RSS(ref_node_location(ref_node, nodes[0]), "loc");
        RSS(ref_geom_tattle(ref_geom, nodes[0]), "tatt");
      });
      RSS(ref_geom_cell_tuv(ref_geom, nodes[0], nodes, REF_GEOM_EDGE, &tvalue,
                            &sens),
          "from");
      if (-1 == sens) local = nnode - 1;
      t[local] = tvalue;
      RSS(ref_egads_edge_face_uv(ref_geom, edgeid, faceid, sense, t[local],
                                 &(uv[2 * local])),
          "p-curve uv");
      RSS(ref_dict_location(ref_dict, nodes[1], &local), "localize");
      RSS(ref_geom_cell_tuv(ref_geom, nodes[1], nodes, REF_GEOM_EDGE, &tvalue,
                            &sens),
          "from");
      if (-1 == sens) local = nnode - 1;
      t[local] = tvalue;
      RSS(ref_egads_edge_face_uv(ref_geom, edgeid, faceid, sense, t[local],
                                 &(uv[2 * local])),
          "p-curve uv");
    }
  }

  each_ref_dict_key_value(ref_dict, item, node, geom) {
    radius = 0;
    gap = 0;
    xyz[0] = ref_node_xyz(ref_node, 0, node);
    xyz[1] = ref_node_xyz(ref_node, 1, node);
    xyz[2] = ref_node_xyz(ref_node, 2, node);
    if (ref_geom_model_loaded(ref_geom)) {
      RSS(ref_egads_edge_curvature(ref_geom, geom, &radius, normal), "curve");
      radius = ABS(radius);
      RSS(ref_egads_edge_face_uv(ref_geom, edgeid, faceid, sense, t[item],
                                 &(uv[2 * item])),
          "p-curve uv");
      RSS(ref_egads_eval_at(ref_geom, REF_GEOM_FACE, faceid, &(uv[2 * item]),
                            xyz, NULL),
          "eval at");
      RSS(ref_egads_gap(ref_geom, node, &gap), "gap")
    }
    fprintf(file, " %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e\n", xyz[0],
            xyz[1], xyz[2], gap, uv[0 + 2 * item], uv[1 + 2 * item], radius,
            t[item]);
  }
  if (REF_EMPTY != jump_geom) {
    node = ref_geom_node(ref_geom, jump_geom);
    radius = 0;
    gap = 0;
    xyz[0] = ref_node_xyz(ref_node, 0, node);
    xyz[1] = ref_node_xyz(ref_node, 1, node);
    xyz[2] = ref_node_xyz(ref_node, 2, node);
    if (ref_geom_model_loaded(ref_geom)) {
      RSS(ref_egads_edge_curvature(ref_geom, jump_geom, &radius, normal),
          "curve");
      radius = ABS(radius);
      RSS(ref_egads_edge_face_uv(ref_geom, edgeid, faceid, sense, t[nnode - 1],
                                 &(uv[2 * (nnode - 1)])),
          "p-curve uv");
      RSS(ref_egads_eval_at(ref_geom, REF_GEOM_FACE, faceid,
                            &(uv[2 * (nnode - 1)]), xyz, NULL),
          "eval at");
      RSS(ref_egads_gap(ref_geom, node, &gap), "gap")
    }
    node = ref_geom_node(ref_geom, jump_geom);
    fprintf(file, " %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e\n", xyz[0],
            xyz[1], xyz[2], gap, uv[0 + 2 * (nnode - 1)],
            uv[1 + 2 * (nnode - 1)], radius, t[nnode - 1]);
  }
  ref_free(uv);
  ref_free(t);

  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    if (edgeid == nodes[2]) {
      RSS(ref_dict_location(ref_dict, nodes[0], &local), "localize");
      RSS(ref_geom_cell_tuv(ref_geom, nodes[0], nodes, REF_GEOM_EDGE, &tvalue,
                            &sens),
          "from");
      if (-1 == sens) local = nnode - 1;
      fprintf(file, " %d", local + 1);
      RSS(ref_dict_location(ref_dict, nodes[1], &local), "localize");
      RSS(ref_geom_cell_tuv(ref_geom, nodes[1], nodes, REF_GEOM_EDGE, &tvalue,
                            &sens),
          "from");
      if (-1 == sens) local = nnode - 1;
      fprintf(file, " %d", local + 1);
      fprintf(file, "\n");
    }
  }

  RSS(ref_dict_free(ref_dict), "free dict");

  return REF_SUCCESS;
}